

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prog.cc
# Opt level: O2

uint32_t duckdb_re2::Prog::EmptyFlags(StringPiece *text,char *p)

{
  uint8_t c;
  char *pcVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  char *pcVar5;
  uint uVar6;
  
  pcVar1 = text->data_;
  if (pcVar1 == p) {
    pcVar5 = pcVar1 + text->size_;
    if (pcVar5 == p) {
      uVar4 = 0xf;
      goto LAB_01b28f52;
    }
    uVar6 = 5;
  }
  else {
    c = p[-1];
    uVar6 = (uint)(c == '\n');
    pcVar5 = pcVar1 + text->size_;
    if (pcVar5 == p) {
      bVar2 = IsWordChar(c);
      uVar4 = (uint)bVar2 * 0x10 + (uint)(c == '\n') + 10;
      goto LAB_01b28f52;
    }
  }
  if ((p < pcVar5) && (*p == '\n')) {
    uVar6 = uVar6 | 2;
  }
  if (pcVar1 == p) {
    bVar2 = IsWordChar(*p);
  }
  else {
    bVar2 = IsWordChar(p[-1]);
    bVar3 = IsWordChar(*p);
    bVar2 = bVar3 != bVar2;
  }
  uVar4 = uVar6 + 0x10;
  if (bVar2 == false) {
    uVar4 = uVar6;
  }
LAB_01b28f52:
  return uVar4 + (~uVar4 & 0x10) * 2;
}

Assistant:

uint32_t Prog::EmptyFlags(const StringPiece& text, const char* p) {
  int flags = 0;

  // ^ and \A
  if (p == text.data())
    flags |= kEmptyBeginText | kEmptyBeginLine;
  else if (p[-1] == '\n')
    flags |= kEmptyBeginLine;

  // $ and \z
  if (p == text.data() + text.size())
    flags |= kEmptyEndText | kEmptyEndLine;
  else if (p < text.data() + text.size() && p[0] == '\n')
    flags |= kEmptyEndLine;

  // \b and \B
  if (p == text.data() && p == text.data() + text.size()) {
    // no word boundary here
  } else if (p == text.data()) {
    if (IsWordChar(p[0]))
      flags |= kEmptyWordBoundary;
  } else if (p == text.data() + text.size()) {
    if (IsWordChar(p[-1]))
      flags |= kEmptyWordBoundary;
  } else {
    if (IsWordChar(p[-1]) != IsWordChar(p[0]))
      flags |= kEmptyWordBoundary;
  }
  if (!(flags & kEmptyWordBoundary))
    flags |= kEmptyNonWordBoundary;

  return flags;
}